

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O0

TPM_RC TPMS_NV_PUBLIC_Unmarshal(TPMS_NV_PUBLIC *target,BYTE **buffer,INT32 *size)

{
  TPM_RC result;
  INT32 *size_local;
  BYTE **buffer_local;
  TPMS_NV_PUBLIC *target_local;
  
  target_local._4_4_ = TPMI_RH_NV_INDEX_Unmarshal(&target->nvIndex,buffer,size);
  if ((((target_local._4_4_ == 0) &&
       (target_local._4_4_ = TPMI_ALG_HASH_Unmarshal(&target->nameAlg,buffer,size,0),
       target_local._4_4_ == 0)) &&
      (target_local._4_4_ = TPMA_NV_Unmarshal(&target->attributes,buffer,size),
      target_local._4_4_ == 0)) &&
     ((target_local._4_4_ = TPM2B_DIGEST_Unmarshal(&target->authPolicy,buffer,size),
      target_local._4_4_ == 0 &&
      (target_local._4_4_ = UINT16_Unmarshal(&target->dataSize,buffer,size), target_local._4_4_ == 0
      )))) {
    if (target->dataSize < 0x801) {
      target_local._4_4_ = 0;
    }
    else {
      target_local._4_4_ = 0x95;
    }
  }
  return target_local._4_4_;
}

Assistant:

TPM_RC
TPMS_NV_PUBLIC_Unmarshal(TPMS_NV_PUBLIC *target, BYTE **buffer, INT32 *size)
{
    TPM_RC    result;
    result = TPMI_RH_NV_INDEX_Unmarshal((TPMI_RH_NV_INDEX *)&(target->nvIndex), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = TPMI_ALG_HASH_Unmarshal((TPMI_ALG_HASH *)&(target->nameAlg), buffer, size, 0);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = TPMA_NV_Unmarshal((TPMA_NV *)&(target->attributes), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = TPM2B_DIGEST_Unmarshal((TPM2B_DIGEST *)&(target->authPolicy), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = UINT16_Unmarshal((UINT16 *)&(target->dataSize), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    if( (target->dataSize> MAX_NV_INDEX_SIZE))
        return TPM_RC_SIZE;
    return TPM_RC_SUCCESS;
}